

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall
SchnorrPubkey_TweakAddFromPrivkey_Test::TestBody(SchnorrPubkey_TweakAddFromPrivkey_Test *this)

{
  char *pcVar1;
  bool parity;
  AssertionResult gtest_ar_3;
  Privkey key;
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  Privkey tweaked_sk;
  ByteData256 tweak1;
  string exp_privkey1;
  SchnorrPubkey actual_pubkey;
  string exp_pubkey1;
  
  std::__cxx11::string::string
            ((string *)&tweaked_sk,
             "45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476",
             (allocator *)&exp_pubkey1);
  cfd::core::ByteData256::ByteData256(&tweak1,(string *)&tweaked_sk);
  std::__cxx11::string::~string((string *)&tweaked_sk);
  cfd::core::Privkey::Privkey(&tweaked_sk);
  parity = false;
  cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
            (&actual_pubkey,&::sk,&tweak1,&tweaked_sk,&parity);
  std::__cxx11::string::string
            ((string *)&exp_pubkey1,
             "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             (allocator *)&exp_privkey1);
  std::__cxx11::string::string
            ((string *)&exp_privkey1,
             "dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",(allocator *)&key);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&key,&actual_pubkey);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pubkey1","actual_pubkey.GetHex()",&exp_pubkey1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&key);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x99,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&key,&tweaked_sk);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_privkey1","tweaked_sk.GetHex()",&exp_privkey1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&key);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&key,"pubkey_parity","parity",&pubkey_parity,&parity);
  if ((char)key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)key.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x9b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Privkey::Privkey(&key,&::sk);
  if (parity == true) {
    cfd::core::Privkey::CreateNegate((Privkey *)&gtest_ar,&key);
    cfd::core::Privkey::operator=(&key,(Privkey *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  cfd::core::Privkey::CreateTweakAdd((Privkey *)&gtest_ar,&key,&tweak1);
  cfd::core::Privkey::operator=(&key,(Privkey *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&gtest_ar,&key);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_3,"exp_privkey1","key.GetHex()",&exp_privkey1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xa0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  std::__cxx11::string::~string((string *)&exp_privkey1);
  std::__cxx11::string::~string((string *)&exp_pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_sk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakAddFromPrivkey) {
  ByteData256 tweak1("45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476");
  Privkey tweaked_sk;
  bool parity = false;
  auto actual_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
      sk, tweak1, &tweaked_sk, &parity);

  std::string exp_pubkey1 = "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440";
  std::string exp_privkey1 = "dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8";

  EXPECT_EQ(exp_pubkey1, actual_pubkey.GetHex());
  EXPECT_EQ(exp_privkey1, tweaked_sk.GetHex());
  EXPECT_EQ(pubkey_parity, parity);

  Privkey key = sk;
  if (parity) key = key.CreateNegate();
  key = key.CreateTweakAdd(tweak1);
  EXPECT_EQ(exp_privkey1, key.GetHex());
}